

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

Status __thiscall
soplex::SoPlexBase<double>::_solveRealStable
          (SoPlexBase<double> *this,bool acceptUnbounded,bool acceptInfeasible,
          VectorBase<double> *primal,VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols,
          bool forceNoSimplifier)

{
  SPxSolverBase<double> *this_00;
  int value;
  int value_00;
  int iVar1;
  int value_01;
  int value_02;
  Verbosity VVar2;
  Settings *pSVar3;
  ostream *poVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  Status SVar14;
  SPxOut *pSVar15;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  bool bVar16;
  bool bVar17;
  bool fromscratch;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar20 = (this->_slufactor).lastThreshold;
  pSVar3 = this->_currentSettings;
  value = pSVar3->_intParamValues[0xe];
  value_00 = pSVar3->_intParamValues[0xd];
  iVar1 = pSVar3->_intParamValues[2];
  value_01 = pSVar3->_intParamValues[10];
  value_02 = pSVar3->_intParamValues[0xb];
  if (((forceNoSimplifier) && (DAT_003b7f60 < 1)) && (-1 < DAT_003b7fd0)) {
    this->_boostedSimplifier =
         (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    this->_simplifier = (SPxSimplifier<double> *)0x0;
    pSVar3->_intParamValues[10] = 0;
  }
  this_00 = &this->_solver;
  bVar17 = true;
  bVar10 = false;
  bVar7 = false;
  bVar12 = false;
  bVar13 = false;
  bVar8 = false;
  bVar5 = false;
  bVar11 = false;
  bVar9 = false;
  bVar16 = false;
  fromscratch = false;
LAB_00344891:
  while( true ) {
    while( true ) {
      SVar14 = _solveRealForRational(this,fromscratch,primal,dual,basisStatusRows,basisStatusCols);
      if (SVar14 == INFEASIBLE) {
        if (acceptInfeasible) goto LAB_00345395;
      }
      else if (SVar14 == OPTIMAL) goto LAB_00345395;
      if ((acceptUnbounded && SVar14 == UNBOUNDED) || ((uint)(SVar14 + (INForUNBD|INFEASIBLE)) < 2))
      goto LAB_00345395;
      if ((bVar17) && (VVar2 = (this->spxout).m_verbosity, 2 < (int)VVar2)) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Numerical troubles during floating-point solve.",
                   0x2f);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar6 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar2;
      }
      if ((!bVar8) &&
         ((this->_currentSettings->_intParamValues[10] != 0 ||
          (this->_currentSettings->_intParamValues[0xb] != 0)))) goto LAB_00344b8e;
      setIntParam(this,SCALER,value_02,true);
      setIntParam(this,SIMPLIFIER,value_01,true);
      if (bVar9) break;
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Increasing Markowitz threshold.",0x1f);
        poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar6 = (char)poVar4;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
        std::ostream::put(cVar6);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar2;
      }
      (this->_slufactor).lastThreshold = 0.9;
      (this->_slufactor).minThreshold = 0.9;
      bVar9 = true;
      bVar17 = false;
      SPxSolverBase<double>::factorize(this_00);
    }
    if (bVar16) break;
    VVar2 = (this->spxout).m_verbosity;
    bVar9 = true;
    bVar17 = false;
    bVar16 = true;
    fromscratch = true;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Solving from scratch.",0x15);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
      goto LAB_0034508e;
    }
  }
  setIntParam(this,RATIOTESTER,value,true);
  setIntParam(this,PRICER,value_00,true);
  if (bVar10) {
    if (bVar7 || forceNoSimplifier) {
      if ((DAT_003b7f60 < 1) && (-1 < DAT_003b7fd0)) {
        this->_boostedSimplifier =
             (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
        this->_simplifier = (SPxSimplifier<double> *)0x0;
        this->_currentSettings->_intParamValues[10] = 0;
      }
      if (bVar11) {
        if (SVar14 == INFEASIBLE || bVar5) {
          if ((DAT_003b7f40 <= iVar1) && (iVar1 <= DAT_003b7fb0)) {
            this->_currentSettings->_intParamValues[2] = iVar1;
          }
          VVar2 = (this->spxout).m_verbosity;
          if (bVar12) {
            if (bVar13) {
              if (2 < (int)VVar2) {
                (this->spxout).m_verbosity = INFO1;
                pSVar15 = operator<<(&this->spxout,"Giving up.");
                std::endl<char,std::char_traits<char>>(pSVar15->m_streams[pSVar15->m_verbosity]);
                (this->spxout).m_verbosity = VVar2;
              }
LAB_00345395:
              dVar18 = 0.0001;
              if (0.0001 <= dVar20) {
                dVar18 = dVar20;
              }
              dVar20 = 0.9999;
              if (dVar18 <= 0.9999) {
                dVar20 = dVar18;
              }
              (this->_slufactor).minThreshold = dVar20;
              (this->_slufactor).lastThreshold = dVar20;
              setIntParam(this,RATIOTESTER,value,true);
              setIntParam(this,PRICER,value_00,true);
              setIntParam(this,SIMPLIFIER,value_01,true);
              setIntParam(this,SCALER,value_02,true);
              if ((DAT_003b7f40 <= iVar1) && (iVar1 <= DAT_003b7fb0)) {
                this->_currentSettings->_intParamValues[2] = iVar1;
              }
              return SVar14;
            }
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching pricer.",0x11);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar6 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar2;
            }
            SPxSolverBase<double>::setType
                      (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((SPxDevexPR<double> *)(this->_solver).thepricer == &this->_pricerDevex) {
              bVar17 = false;
              bVar10 = true;
              bVar12 = true;
              bVar13 = true;
              bVar11 = true;
              bVar9 = true;
              bVar16 = false;
              if (DAT_003b7fdc < 5 || 5 < DAT_003b7f6c) goto LAB_00344891;
              SPxSolverBase<double>::setPricer
                        (this_00,(SPxPricer<double> *)&this->_pricerSteep,false);
              this->_currentSettings->_intParamValues[0xd] = 5;
            }
            else {
              bVar17 = false;
              bVar10 = true;
              bVar12 = true;
              bVar13 = true;
              bVar11 = true;
              bVar9 = true;
              bVar16 = false;
              if (DAT_003b7fdc < 3 || 3 < DAT_003b7f6c) goto LAB_00344891;
              SPxSolverBase<double>::setPricer
                        (this_00,&(this->_pricerDevex).super_SPxPricer<double>,false);
              this->_currentSettings->_intParamValues[0xd] = 3;
            }
            bVar12 = true;
            bVar13 = true;
          }
          else {
            if (2 < (int)VVar2) {
              (this->spxout).m_verbosity = INFO1;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->spxout).m_streams[3],"Switching ratio test.",0x15);
              poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
              cVar6 = (char)poVar4;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              (this->spxout).m_verbosity = VVar2;
            }
            SPxSolverBase<double>::setType
                      (this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
            if ((this->_solver).theratiotester ==
                &(this->_ratiotesterTextbook).super_SPxRatioTester<double>) {
              bVar17 = false;
              bVar10 = true;
              bVar12 = true;
              bVar11 = true;
              bVar9 = true;
              bVar16 = false;
              if (DAT_003b7fe0 < 2 || 2 < DAT_003b7f70) goto LAB_00344891;
              SPxSolverBase<double>::setTester
                        (this_00,&(this->_ratiotesterFast).super_SPxRatioTester<double>,false);
              this->_currentSettings->_intParamValues[0xe] = 2;
            }
            else {
              bVar17 = false;
              bVar10 = true;
              bVar12 = true;
              bVar11 = true;
              bVar9 = true;
              bVar16 = false;
              if (DAT_003b7fe0 < 0 || 0 < DAT_003b7f70) goto LAB_00344891;
              SPxSolverBase<double>::setTester
                        (this_00,&(this->_ratiotesterTextbook).super_SPxRatioTester<double>,false);
              this->_currentSettings->_intParamValues[0xe] = 0;
            }
            bVar12 = true;
          }
        }
        else {
          VVar2 = (this->spxout).m_verbosity;
          if (2 < (int)VVar2) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Tightening tolerances.",0x16);
            poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
            cVar6 = (char)poVar4;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
            std::ostream::put(cVar6);
            std::ostream::flush();
            (this->spxout).m_verbosity = VVar2;
          }
          if ((DAT_003b7f40 < 2) && (0 < DAT_003b7fb0)) {
            this->_currentSettings->_intParamValues[2] = 1;
          }
          dVar18 = SPxSolverBase<double>::entertol(this_00);
          dVar19 = 0.001;
          if (dVar18 < 1e-06) {
            dVar19 = SPxSolverBase<double>::entertol(this_00);
            dVar19 = 1e-09 / dVar19;
          }
          (this->_solver).entertolscale = dVar19;
          dVar18 = SPxSolverBase<double>::entertol(this_00);
          bVar5 = dVar18 <= 1e-09;
        }
        bVar11 = true;
      }
      else {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Relaxing tolerances.",0x14);
          poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar6 = (char)poVar4;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar2;
        }
        if ((DAT_003b7f40 < 1) && (-1 < DAT_003b7fb0)) {
          this->_currentSettings->_intParamValues[2] = 0;
        }
        dVar18 = SPxSolverBase<double>::entertol(this_00);
        dVar19 = 1000.0;
        if (1e-06 < dVar18) {
          dVar19 = SPxSolverBase<double>::entertol(this_00);
          dVar19 = 0.001 / dVar19;
        }
        (this->_solver).entertolscale = dVar19;
        dVar18 = SPxSolverBase<double>::leavetol(this_00);
        dVar19 = 1000.0;
        if (1e-06 < dVar18) {
          dVar19 = SPxSolverBase<double>::leavetol(this_00);
          dVar19 = 0.001 / dVar19;
        }
        (this->_solver).leavetolscale = dVar19;
        dVar18 = SPxSolverBase<double>::entertol(this_00);
        bVar11 = 0.001 <= dVar18;
      }
      bVar10 = true;
      bVar17 = false;
      bVar9 = true;
      bVar16 = false;
      goto LAB_00344891;
    }
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Switching simplification.",0x19);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
    }
    if (value_01 == 0) {
      setIntParam(this,SIMPLIFIER,3,true);
    }
    else {
      bVar17 = false;
      bVar10 = true;
      bVar7 = true;
      bVar9 = true;
      bVar16 = true;
      fromscratch = true;
      if (0 < DAT_003b7f60) goto LAB_00344891;
      bVar7 = true;
      bVar9 = true;
      bVar16 = true;
      fromscratch = true;
      if (DAT_003b7fd0 < 0) goto LAB_00344891;
      this->_boostedSimplifier =
           (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_simplifier = (SPxSimplifier<double> *)0x0;
      this->_currentSettings->_intParamValues[10] = 0;
    }
    bVar7 = true;
  }
  else {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Switching scaling.",0x12);
      poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar6 = (char)poVar4;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar2;
    }
    if (value_02 == 0) {
      setIntParam(this,SCALER,2,true);
    }
    else {
      bVar17 = false;
      bVar10 = true;
      bVar9 = true;
      bVar16 = true;
      fromscratch = true;
      if (0 < DAT_003b7f64) goto LAB_00344891;
      bVar9 = true;
      bVar16 = true;
      fromscratch = true;
      if (DAT_003b7fd4 < 0) goto LAB_00344891;
      this->_boostedScaler =
           (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0;
      this->_scaler = (SPxScaler<double> *)0x0;
      this->_currentSettings->_intParamValues[0xb] = 0;
    }
  }
  bVar10 = true;
  bVar9 = true;
  goto LAB_0034508e;
LAB_00344b8e:
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Turning off preprocessing.",0x1a);
    poVar4 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar6 = (char)poVar4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar6);
    std::ostream::put(cVar6);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar2;
  }
  if ((DAT_003b7f64 < 1) && (-1 < DAT_003b7fd4)) {
    this->_boostedScaler =
         (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    this->_scaler = (SPxScaler<double> *)0x0;
    this->_currentSettings->_intParamValues[0xb] = 0;
  }
  bVar17 = false;
  bVar8 = true;
  bVar16 = true;
  fromscratch = true;
  if (0 < DAT_003b7f60) goto LAB_00344891;
  bVar16 = true;
  fromscratch = true;
  if (DAT_003b7fd0 < 0) goto LAB_00344891;
  this->_boostedSimplifier =
       (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  this->_simplifier = (SPxSimplifier<double> *)0x0;
  this->_currentSettings->_intParamValues[10] = 0;
LAB_0034508e:
  bVar17 = false;
  bVar16 = true;
  fromscratch = true;
  goto LAB_00344891;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}